

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O3

int SUNNonlinSolSolve_Newton
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,sunrealtype tol,
              int callLSetup,void *mem)

{
  long *plVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 *puVar4;
  int iVar5;
  undefined8 uVar6;
  bool bVar7;
  
  puVar4 = (undefined8 *)NLS->content;
  uVar2 = puVar4[4];
  *(undefined4 *)((long)puVar4 + 0x2c) = 0;
  puVar4[7] = 0;
  puVar4[8] = 0;
  iVar3 = (*(code *)*puVar4)(ycor,uVar2,mem);
  if (iVar3 == 0) {
    bVar7 = callLSetup == 0;
    uVar6 = 0;
    while ((bVar7 || (iVar3 = (**(code **)((long)NLS->content + 8))
                                        (uVar6,(long)NLS->content + 0x28,mem), iVar3 == 0))) {
      do {
        plVar1 = (long *)((long)NLS->content + 0x38);
        *plVar1 = *plVar1 + 1;
        N_VScale(0,uVar2,uVar2);
        iVar3 = (**(code **)((long)NLS->content + 0x10))(uVar2,mem);
        if (iVar3 != 0) break;
        N_VLinearSum(0,0,ycor,uVar2,ycor);
        iVar3 = (**(code **)((long)NLS->content + 0x18))
                          (SUB84(tol,0),NLS,ycor,uVar2,w,*(undefined8 *)((long)NLS->content + 0x48))
        ;
        puVar4 = (undefined8 *)NLS->content;
        iVar5 = *(int *)((long)puVar4 + 0x2c) + 1;
        *(int *)((long)puVar4 + 0x2c) = iVar5;
        if (iVar3 != 0x385) {
          if (iVar3 == 0) {
            *(undefined4 *)(puVar4 + 5) = 0;
            return 0;
          }
          break;
        }
        if (*(int *)(puVar4 + 6) <= iVar5) {
          iVar3 = 0x386;
          goto LAB_001325ee;
        }
        iVar3 = (*(code *)*puVar4)(ycor,uVar2,mem);
      } while (iVar3 == 0);
      if (iVar3 < 1) break;
      puVar4 = (undefined8 *)NLS->content;
LAB_001325ee:
      if ((*(int *)(puVar4 + 5) != 0) || (puVar4[1] == 0)) break;
      puVar4[8] = puVar4[8] + 1;
      N_VConst(0,ycor);
      puVar4 = (undefined8 *)NLS->content;
      *(undefined4 *)((long)puVar4 + 0x2c) = 0;
      iVar3 = (*(code *)*puVar4)(ycor,uVar2,mem);
      uVar6 = 1;
      bVar7 = false;
      if (iVar3 != 0) break;
    }
  }
  plVar1 = (long *)((long)NLS->content + 0x40);
  *plVar1 = *plVar1 + 1;
  return iVar3;
}

Assistant:

int SUNNonlinSolSolve_Newton(SUNNonlinearSolver NLS,
                             SUNDIALS_MAYBE_UNUSED N_Vector y0, N_Vector ycor,
                             N_Vector w, sunrealtype tol,
                             sunbooleantype callLSetup, void* mem)
{
  SUNFunctionBegin(NLS->sunctx);
  /* local variables */
  int retval;
  sunbooleantype jbad;
  N_Vector delta;

  /* check that all required function pointers have been set */
  SUNAssert(NEWTON_CONTENT(NLS)->Sys && NEWTON_CONTENT(NLS)->CTest &&
              NEWTON_CONTENT(NLS)->LSolve,
            SUN_ERR_ARG_CORRUPT);
  SUNAssert(!callLSetup || (callLSetup && NEWTON_CONTENT(NLS)->LSetup),
            SUN_ERR_ARG_CORRUPT);

  SUNLogInfo(NLS->sunctx->logger, "nonlinear-solver", "solver = Newton");

  /* set local shortcut variables */
  delta = NEWTON_CONTENT(NLS)->delta;

  /* assume the Jacobian is good */
  jbad = SUNFALSE;

  /* initialize iteration and convergence fail counters for this solve */
  NEWTON_CONTENT(NLS)->niters     = 0;
  NEWTON_CONTENT(NLS)->nconvfails = 0;

  /* looping point for attempts at solution of the nonlinear system:
       Evaluate the nonlinear residual function (store in delta)
       Setup the linear solver if necessary
       Perform Newton iteration */
  for (;;)
  {
    SUNLogInfo(NLS->sunctx->logger, "begin-nonlinear-iterate", "");

    /* initialize current iteration counter for this solve attempt */
    NEWTON_CONTENT(NLS)->curiter = 0;

    /* compute the nonlinear residual, store in delta */
    retval = NEWTON_CONTENT(NLS)->Sys(ycor, delta, mem);
    if (retval != SUN_SUCCESS) { break; }

    /* if indicated, setup the linear system */
    if (callLSetup)
    {
      retval = NEWTON_CONTENT(NLS)->LSetup(jbad, &(NEWTON_CONTENT(NLS)->jcur),
                                           mem);
      if (retval != SUN_SUCCESS) { break; }
    }

    /* looping point for Newton iteration. Break out on any error. */
    for (;;)
    {
      /* increment nonlinear solver iteration counter */
      NEWTON_CONTENT(NLS)->niters++;

      /* compute the negative of the residual for the linear system rhs */
      N_VScale(-ONE, delta, delta);
      SUNCheckLastErr();

      /* solve the linear system to get Newton update delta */
      retval = NEWTON_CONTENT(NLS)->LSolve(delta, mem);
      if (retval != SUN_SUCCESS) { break; }

      /* update the Newton iterate */
      N_VLinearSum(ONE, ycor, ONE, delta, ycor);
      SUNCheckLastErr();

      /* test for convergence */
      retval = NEWTON_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                          NEWTON_CONTENT(NLS)->ctest_data);

      NEWTON_CONTENT(NLS)->curiter++;

      SUNLogInfo(NLS->sunctx->logger, "nonlinear-iterate",
                 "cur-iter = %i, total-iters = %li, update-norm = %.16g",
                 NEWTON_CONTENT(NLS)->curiter, NEWTON_CONTENT(NLS)->niters,
                 N_VWrmsNorm(delta, w));

      /* if successful update Jacobian status and return */
      if (retval == SUN_SUCCESS)
      {
        SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                   "status = success");
        NEWTON_CONTENT(NLS)->jcur = SUNFALSE;
        return SUN_SUCCESS;
      }

      /* check if the iteration should continue; otherwise exit Newton loop */
      if (retval != SUN_NLS_CONTINUE) { break; }

      /* not yet converged, test for max allowed iterations. */
      if (NEWTON_CONTENT(NLS)->curiter >= NEWTON_CONTENT(NLS)->maxiters)
      {
        retval = SUN_NLS_CONV_RECVR;
        break;
      }

      SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = continue");
      SUNLogInfo(NLS->sunctx->logger, "begin-nonlinear-iterate", "");

      /* compute the nonlinear residual, store in delta */
      retval = NEWTON_CONTENT(NLS)->Sys(ycor, delta, mem);
      if (retval != SUN_SUCCESS) { break; }

    } /* end of Newton iteration loop */

    /* all errors go here */

    /* If there is a recoverable convergence failure and the Jacobian-related
       data appears not to be current, increment the convergence failure count,
       reset the initial correction to zero, and loop again with a call to
       lsetup in which jbad is TRUE. Otherwise break out and return. */
    if ((retval > 0) && !(NEWTON_CONTENT(NLS)->jcur) &&
        (NEWTON_CONTENT(NLS)->LSetup))
    {
      NEWTON_CONTENT(NLS)->nconvfails++;
      callLSetup = SUNTRUE;
      jbad       = SUNTRUE;
      N_VConst(ZERO, ycor);
      SUNCheckLastErr();

      SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = continue");

      continue;
    }
    else
    {
      SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = failure, retval = %i", retval);
      break;
    }

  } /* end of setup loop */

  /* increment number of convergence failures */
  NEWTON_CONTENT(NLS)->nconvfails++;

  /* all error returns exit here */
  return (retval);
}